

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raassignment_p.h
# Opt level: O3

void __thiscall
asmjit::RAAssignment::swap
          (RAAssignment *this,uint32_t group,uint32_t aWorkId,uint32_t aPhysId,uint32_t bWorkId,
          uint32_t bPhysId)

{
  ZoneVectorBase *this_00;
  PhysToWorkMap **this_01;
  WorkToPhysMap *pWVar1;
  PhysToWorkMap *pPVar2;
  undefined8 *__src;
  Error EVar3;
  uint32_t uVar4;
  uint32_t *puVar5;
  uchar *sig;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined4 in_register_00000034;
  ZoneAllocator *pZVar10;
  ZoneAllocator *allocator;
  RAAssignment *this_02;
  RAAssignment *this_03;
  bool bVar11;
  uint uVar12;
  undefined4 in_register_00000084;
  undefined8 uVar13;
  undefined4 in_register_0000008c;
  
  uVar13 = CONCAT44(in_register_00000084,bWorkId);
  pZVar10 = (ZoneAllocator *)CONCAT44(in_register_00000034,group);
  puVar5 = (uint32_t *)(ulong)aPhysId;
  if (aPhysId == bPhysId) {
    swap();
LAB_0011d303:
    swap();
LAB_0011d308:
    swap();
LAB_0011d30d:
    swap();
LAB_0011d312:
    swap();
LAB_0011d317:
    swap();
LAB_0011d31c:
    swap();
LAB_0011d321:
    swap();
LAB_0011d326:
    swap();
LAB_0011d32b:
    swap();
LAB_0011d330:
    swap();
LAB_0011d335:
    uVar4 = (uint32_t)puVar5;
    swap();
LAB_0011d33a:
    bPhysId = uVar4;
    swap();
  }
  else {
    if (aWorkId == 0xffffffff) goto LAB_0011d303;
    uVar12 = (this->_layout).workCount;
    puVar5 = (uint32_t *)(ulong)uVar12;
    if (uVar12 <= aWorkId) goto LAB_0011d308;
    pWVar1 = this->_workToPhysMap;
    if (pWVar1[aWorkId].physIds[0] != aPhysId) goto LAB_0011d30d;
    if (bWorkId == 0xffffffff) goto LAB_0011d312;
    if (uVar12 <= bWorkId) goto LAB_0011d317;
    puVar5 = (uint32_t *)(ulong)pWVar1[bWorkId].physIds[0];
    if (pWVar1[bWorkId].physIds[0] != bPhysId) goto LAB_0011d31c;
    if (0x1f < aPhysId) goto LAB_0011d321;
    puVar5 = this->_physToWorkIds[group];
    if (puVar5[aPhysId] != aWorkId) goto LAB_0011d326;
    if (0x1f < bPhysId) goto LAB_0011d32b;
    if (puVar5[bPhysId] != bWorkId) goto LAB_0011d330;
    if (3 < group) goto LAB_0011d335;
    uVar12 = (this->_physToWorkMap->assigned)._masks[group];
    pZVar10 = (ZoneAllocator *)0x1;
    uVar7 = 1 << ((byte)aPhysId & 0x1f);
    uVar4 = aPhysId;
    if ((uVar12 >> (aPhysId & 0x1f) & 1) == 0) goto LAB_0011d33a;
    uVar8 = 1 << ((byte)bPhysId & 0x1f);
    pZVar10 = (ZoneAllocator *)(ulong)uVar8;
    if ((uVar12 >> (bPhysId & 0x1f) & 1) != 0) {
      pWVar1[aWorkId].physIds[0] = (byte)bPhysId;
      this->_workToPhysMap[bWorkId].physIds[0] = (byte)aPhysId;
      puVar5 = this->_physToWorkIds[group];
      puVar5[aPhysId] = bWorkId;
      puVar5[bPhysId] = aWorkId;
      uVar12 = (this->_physToWorkMap->dirty)._masks[group];
      bVar11 = ((uVar12 & uVar8) != 0) != ((uVar12 & uVar7) != 0);
      uVar8 = uVar8 | uVar7;
      uVar7 = 0;
      if (bVar11) {
        uVar7 = uVar8;
      }
      (this->_physToWorkMap->dirty)._masks[group] = uVar7 ^ uVar12;
      verify(this,(EVP_PKEY_CTX *)(ulong)uVar8,(uchar *)(ulong)(uVar7 ^ uVar12),(ulong)uVar12,
             (uchar *)CONCAT71((int7)((ulong)uVar13 >> 8),bVar11),
             CONCAT44(in_register_0000008c,bPhysId));
      return;
    }
  }
  uVar12 = (uint)uVar13;
  swap();
  if (bPhysId == uVar12) {
    reassign();
LAB_0011d40f:
    reassign();
LAB_0011d414:
    reassign();
LAB_0011d419:
    reassign();
LAB_0011d41e:
    reassign();
LAB_0011d423:
    reassign();
LAB_0011d428:
    reassign();
LAB_0011d42d:
    reassign();
  }
  else {
    uVar7 = (uint)sig;
    if (uVar7 == 0xffffffff) goto LAB_0011d40f;
    if ((this->_layout).workCount <= uVar7) goto LAB_0011d414;
    if (this->_workToPhysMap[(ulong)sig & 0xffffffff].physIds[0] != uVar12) goto LAB_0011d419;
    if (0x1f < uVar12) goto LAB_0011d41e;
    uVar6 = (ulong)pZVar10 & 0xffffffff;
    if (this->_physToWorkIds[uVar6][uVar12] != uVar7) goto LAB_0011d423;
    if (3 < (uint)pZVar10) goto LAB_0011d428;
    uVar8 = (this->_physToWorkMap->assigned)._masks[uVar6];
    uVar9 = 1 << ((byte)uVar12 & 0x1f);
    pZVar10 = (ZoneAllocator *)(ulong)uVar9;
    if ((uVar8 >> (uVar12 & 0x1f) & 1) == 0) goto LAB_0011d42d;
    if (bPhysId < 0x20) {
      if ((uVar8 >> (bPhysId & 0x1f) & 1) == 0) {
        this->_workToPhysMap[(ulong)sig & 0xffffffff].physIds[0] = (byte)bPhysId;
        puVar5 = this->_physToWorkIds[uVar6];
        puVar5[uVar12] = 0xffffffff;
        puVar5[bPhysId] = uVar7;
        pPVar2 = this->_physToWorkMap;
        uVar12 = (pPVar2->dirty)._masks[uVar6];
        uVar8 = 1 << ((byte)bPhysId & 0x1f) | uVar9;
        puVar5 = (pPVar2->assigned)._masks + uVar6;
        *puVar5 = *puVar5 ^ uVar8;
        uVar7 = uVar9 & uVar12;
        if ((uVar9 & uVar12) != 0) {
          uVar7 = uVar8;
        }
        (pPVar2->dirty)._masks[uVar6] = uVar7 ^ uVar12;
        verify(this,(EVP_PKEY_CTX *)(ulong)(uVar7 ^ uVar12),sig,(ulong)uVar12,(uchar *)(ulong)uVar8,
               uVar6);
        return;
      }
      goto LAB_0011d437;
    }
  }
  reassign();
LAB_0011d437:
  reassign();
  uVar12 = *(uint *)this[1]._physToWorkIds;
  allocator = pZVar10;
  if ((ulong)uVar12 != 0) {
    uVar6 = 0;
    do {
      if (*(ZoneAllocator **)(((this[1]._physToWorkMap)->assigned)._masks + uVar6 * 2) == pZVar10) {
        allocator = (ZoneAllocator *)0xffffffff;
        if (uVar6 != 0xffffffff) {
          return;
        }
        break;
      }
      uVar6 = uVar6 + 1;
    } while (uVar12 != uVar6);
  }
  uVar7 = *(uint *)&pZVar10[1]._zone;
  if ((ulong)uVar7 != 0) {
    allocator = (ZoneAllocator *)pZVar10->_dynamicBlocks;
    uVar6 = 0;
    do {
      if (*(RAAssignment **)((long)allocator->_slots + uVar6 * 8 + 0xfffffffffffffff8) == this) {
        allocator = (ZoneAllocator *)0xffffffff;
        if (uVar6 != 0xffffffff) {
          RABlock::appendSuccessor();
          this_02 = this;
          goto LAB_0011d529;
        }
        break;
      }
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  this_02 = this;
  if (*(uint *)((long)(pZVar10 + 1) + 4) == uVar7) {
    this_02 = (RAAssignment *)&pZVar10->_dynamicBlocks;
    allocator = (ZoneAllocator *)((long)*(void **)&this->_layout + 0x18);
    EVar3 = ZoneVectorBase::_grow((ZoneVectorBase *)this_02,allocator,8,1);
    if (EVar3 != 0) {
      return;
    }
    uVar12 = *(uint *)this[1]._physToWorkIds;
  }
  uVar7 = *(uint *)((long)this[1]._physToWorkIds + 4);
  if (uVar7 == uVar12) {
    this_02 = (RAAssignment *)&this[1]._physToWorkMap;
    allocator = (ZoneAllocator *)((long)*(void **)&this->_layout + 0x18);
    EVar3 = ZoneVectorBase::_grow((ZoneVectorBase *)this_02,allocator,8,1);
    if (EVar3 != 0) {
      return;
    }
    uVar12 = *(uint *)this[1]._physToWorkIds;
    uVar7 = *(uint *)((long)this[1]._physToWorkIds + 4);
  }
  if (uVar12 < uVar7) {
    *(ZoneAllocator **)(((this[1]._physToWorkMap)->assigned)._masks + (ulong)uVar12 * 2) = pZVar10;
    *(int *)this[1]._physToWorkIds = *(int *)this[1]._physToWorkIds + 1;
    if (*(uint *)&pZVar10[1]._zone < *(uint *)((long)(pZVar10 + 1) + 4)) {
      *(RAAssignment **)
       ((long)&pZVar10->_dynamicBlocks->prev + (ulong)*(uint *)&pZVar10[1]._zone * 8) = this;
      *(int *)&pZVar10[1]._zone = *(int *)&pZVar10[1]._zone + 1;
      return;
    }
  }
  else {
LAB_0011d529:
    RABlock::appendSuccessor();
  }
  RABlock::appendSuccessor();
  uVar12 = *(uint *)this_02[1]._physToWorkIds;
  if ((ulong)uVar12 != 0) {
    uVar6 = 0;
    do {
      if (*(ZoneAllocator **)(((this_02[1]._physToWorkMap)->assigned)._masks + uVar6 * 2) ==
          allocator) {
        if (uVar6 != 0xffffffff) {
          return;
        }
        break;
      }
      uVar6 = uVar6 + 1;
    } while (uVar12 != uVar6);
  }
  uVar7 = *(uint *)&allocator[1]._zone;
  if ((ulong)uVar7 != 0) {
    uVar6 = 0;
    do {
      if (*(RAAssignment **)((long)&allocator->_dynamicBlocks->prev + uVar6 * 8) == this_02) {
        if (uVar6 != 0xffffffff) {
          RABlock::prependSuccessor();
          this_03 = this_02;
          goto LAB_0011d65b;
        }
        break;
      }
      uVar6 = uVar6 + 1;
    } while (uVar7 != uVar6);
  }
  this_00 = (ZoneVectorBase *)&allocator->_dynamicBlocks;
  this_03 = this_02;
  if (*(uint *)((long)(allocator + 1) + 4) == uVar7) {
    this_03 = (RAAssignment *)this_00;
    EVar3 = ZoneVectorBase::_grow
                      (this_00,(ZoneAllocator *)((long)*(void **)&this_02->_layout + 0x18),8,1);
    if (EVar3 != 0) {
      return;
    }
    uVar12 = *(uint *)this_02[1]._physToWorkIds;
  }
  this_01 = &this_02[1]._physToWorkMap;
  uVar7 = *(uint *)((long)this_02[1]._physToWorkIds + 4);
  if (uVar7 == uVar12) {
    this_03 = (RAAssignment *)this_01;
    EVar3 = ZoneVectorBase::_grow
                      ((ZoneVectorBase *)this_01,
                       (ZoneAllocator *)((long)*(void **)&this_02->_layout + 0x18),8,1);
    if (EVar3 != 0) {
      return;
    }
    uVar12 = *(uint *)this_02[1]._physToWorkIds;
    uVar7 = *(uint *)((long)this_02[1]._physToWorkIds + 4);
  }
  if (uVar12 < uVar7) {
    pPVar2 = *this_01;
    if (uVar12 != 0) {
      this_03 = (RAAssignment *)((pPVar2->assigned)._masks + 2);
      memmove(this_03,pPVar2,(ulong)uVar12 << 3);
    }
    *(ZoneAllocator **)(pPVar2->assigned)._masks = allocator;
    *(int *)this_02[1]._physToWorkIds = *(int *)this_02[1]._physToWorkIds + 1;
    uVar12 = *(uint *)&allocator[1]._zone;
    if (uVar12 < *(uint *)((long)(allocator + 1) + 4)) {
      __src = (undefined8 *)this_00->_data;
      if ((ulong)uVar12 != 0) {
        memmove(__src + 1,__src,(ulong)uVar12 << 3);
      }
      *__src = this_02;
      *(int *)&allocator[1]._zone = *(int *)&allocator[1]._zone + 1;
      return;
    }
  }
  else {
LAB_0011d65b:
    RABlock::prependSuccessor();
  }
  RABlock::prependSuccessor();
  FuncPass::FuncPass((FuncPass *)this_03,"BaseRAPass");
  *(undefined ***)&this_03->_layout = &PTR__BaseRAPass_00154858;
  this_03->_workToPhysMap = (WorkToPhysMap *)0x0;
  this_03->_physToWorkMap = (PhysToWorkMap *)0x0;
  this_03->_physToWorkIds[0] = (uint32_t *)0x0;
  this_03->_physToWorkIds[1] = (uint32_t *)0x0;
  this_03->_physToWorkIds[2] = (uint32_t *)0x0;
  this_03->_physToWorkIds[3] = (uint32_t *)0x0;
  this_03[1]._layout.physIndex = (RARegCount)0x0;
  this_03[1]._layout.physCount = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
  this_03[1]._layout.physTotal = 0;
  this_03[1]._layout.workCount = 0;
  this_03[1]._layout.workRegs = (RAWorkRegs *)0x0;
  this_03[1]._workToPhysMap = (WorkToPhysMap *)0x0;
  this_03[1]._physToWorkMap = (PhysToWorkMap *)0x0;
  this_03[1]._physToWorkIds[0] = (uint32_t *)0x0;
  this_03[1]._physToWorkIds[1] = (uint32_t *)0x0;
  this_03[1]._physToWorkIds[2] = (uint32_t *)0x0;
  *(undefined8 *)((long)this_03[1]._physToWorkIds + 0x14) = 0;
  *(undefined8 *)((long)this_03[1]._physToWorkIds + 0x1c) = 0;
  *(undefined8 *)&this_03[2]._layout.physTotal = 0;
  this_03[2]._layout.workRegs = (RAWorkRegs *)0x0;
  this_03[2]._workToPhysMap = (WorkToPhysMap *)0x0;
  this_03[2]._physToWorkMap = (PhysToWorkMap *)0x0;
  this_03[2]._physToWorkIds[0] = (uint32_t *)0x0;
  this_03[2]._physToWorkIds[1] = (uint32_t *)0x0;
  this_03[2]._physToWorkIds[2] = (uint32_t *)0x0;
  this_03[2]._physToWorkIds[3] = (uint32_t *)0x0;
  this_03[3]._layout.physIndex = (RARegCount)0x0;
  this_03[3]._layout.physCount = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
  this_03[3]._layout.physTotal = 0;
  this_03[3]._layout.workCount = 0;
  this_03[3]._layout.workRegs = (RAWorkRegs *)0x0;
  this_03[3]._workToPhysMap = (WorkToPhysMap *)0x0;
  this_03[3]._physToWorkMap = (PhysToWorkMap *)0x0;
  this_03[3]._physToWorkIds[0] = (uint32_t *)0x0;
  *(undefined8 *)((long)this_03[3]._physToWorkIds + 6) = 0;
  *(undefined8 *)((long)this_03[3]._physToWorkIds + 0xe) = 0;
  this_03[3]._physToWorkIds[3] = (uint32_t *)0x0;
  *(void **)&this_03[4]._layout = (void *)0x0;
  *(undefined8 *)&this_03[4]._layout.physTotal = 0;
  this_03[4]._layout.workRegs = (RAWorkRegs *)0x0;
  *(undefined4 *)&this_03[4]._workToPhysMap = 0;
  *(undefined4 *)(this_03[5]._physToWorkIds + 2) = 0;
  this_03[5]._physToWorkIds[0] = (uint32_t *)0x0;
  this_03[5]._physToWorkIds[1] = (uint32_t *)0x0;
  this_03[5]._workToPhysMap = (WorkToPhysMap *)0x0;
  this_03[5]._physToWorkMap = (PhysToWorkMap *)0x0;
  this_03[5]._layout.physTotal = 0;
  this_03[5]._layout.workCount = 0;
  this_03[5]._layout.workRegs = (RAWorkRegs *)0x0;
  this_03[4]._physToWorkIds[3] = (uint32_t *)0x0;
  this_03[5]._layout.physIndex = (RARegCount)0x0;
  this_03[5]._layout.physCount = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
  this_03[4]._physToWorkIds[1] = (uint32_t *)0x0;
  this_03[4]._physToWorkIds[2] = (uint32_t *)0x0;
  this_03[4]._physToWorkMap = (PhysToWorkMap *)0x0;
  this_03[4]._physToWorkIds[0] = (uint32_t *)0x0;
  this_03[6]._workToPhysMap = (WorkToPhysMap *)0x0;
  this_03[6]._physToWorkMap = (PhysToWorkMap *)0x0;
  *(undefined8 *)&this_03[6]._layout.physTotal = 0;
  this_03[6]._layout.workRegs = (RAWorkRegs *)0x0;
  this_03[5]._physToWorkIds[3] = (uint32_t *)0x0;
  *(void **)&this_03[6]._layout = (void *)0x0;
  this_03[6]._physToWorkIds[0] = (uint32_t *)0xff00000001;
  this_03[6]._physToWorkIds[1] = (uint32_t *)0x0;
  this_03[6]._physToWorkIds[2] = (uint32_t *)0xff00000001;
  this_03[7]._layout.physTotal = 0;
  this_03[7]._layout.workCount = 0;
  this_03[6]._physToWorkIds[3] = (uint32_t *)0x0;
  this_03[7]._layout.physIndex = (RARegCount)0x0;
  this_03[7]._layout.physCount = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
  *(undefined4 *)&this_03[7]._layout.workRegs = 1;
  this_03[7]._physToWorkIds[0] = (uint32_t *)0x0;
  this_03[7]._workToPhysMap = (WorkToPhysMap *)0x0;
  this_03[7]._physToWorkMap = (PhysToWorkMap *)0x0;
  *(undefined1 *)(this_03[7]._physToWorkIds + 1) = 0xff;
  memset((void *)((long)this_03[7]._physToWorkIds + 9),0,0x103);
  this_03[0xb]._workToPhysMap = (WorkToPhysMap *)0x0;
  this_03[0xb]._physToWorkMap = (PhysToWorkMap *)0x0;
  this_03[0xb]._physToWorkIds[0] = (uint32_t *)0x0;
  *(undefined1 *)&this_03[0xb]._physToWorkMap = 0x20;
  this_03[0xb]._physToWorkIds[1] = (uint32_t *)0x57;
  this_03[0xb]._physToWorkIds[2] = (uint32_t *)(this_03[0xb]._physToWorkIds + 3);
  *(undefined1 *)(this_03[0xb]._physToWorkIds + 3) = 0;
  return;
}

Assistant:

ASMJIT_INLINE void swap(uint32_t group, uint32_t aWorkId, uint32_t aPhysId, uint32_t bWorkId, uint32_t bPhysId) noexcept {
    ASMJIT_ASSERT(aPhysId != bPhysId);
    ASMJIT_ASSERT(workToPhysId(group, aWorkId) == aPhysId);
    ASMJIT_ASSERT(workToPhysId(group, bWorkId) == bPhysId);
    ASMJIT_ASSERT(physToWorkId(group, aPhysId) == aWorkId);
    ASMJIT_ASSERT(physToWorkId(group, bPhysId) == bWorkId);
    ASMJIT_ASSERT(isPhysAssigned(group, aPhysId));
    ASMJIT_ASSERT(isPhysAssigned(group, bPhysId));

    _workToPhysMap->physIds[aWorkId] = uint8_t(bPhysId);
    _workToPhysMap->physIds[bWorkId] = uint8_t(aPhysId);
    _physToWorkIds[group][aPhysId] = bWorkId;
    _physToWorkIds[group][bPhysId] = aWorkId;

    uint32_t aMask = Support::bitMask(aPhysId);
    uint32_t bMask = Support::bitMask(bPhysId);

    uint32_t flipMask = Support::bitMaskFromBool<uint32_t>(
      ((_physToWorkMap->dirty[group] & aMask) != 0) ^
      ((_physToWorkMap->dirty[group] & bMask) != 0));

    uint32_t regMask = aMask | bMask;
    _physToWorkMap->dirty[group] ^= regMask & flipMask;

    verify();
  }